

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 __nptr [8];
  char cVar1;
  int iVar2;
  size_t __i;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  istream *piVar7;
  size_t sVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_type sVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 uVar14;
  bool need_singles;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  char **ppcVar15;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  undefined4 in_register_0000003c;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  string dic_name;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> dic_1;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> dic;
  string dic_name_1;
  string file_name;
  KeyReader reader;
  undefined1 local_15e8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15c0;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> local_15b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_15a0;
  string local_1598;
  char **local_1578;
  allocator local_1569;
  long local_1568;
  ulong local_1560;
  ulong local_1558;
  undefined8 local_1550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1548;
  undefined1 local_1540 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1530;
  undefined8 auStack_1520 [12];
  ios_base local_14c0 [112];
  char acStack_1450 [152];
  undefined1 local_13b8 [8];
  ulong local_13b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13a8;
  uint auStack_1398 [54];
  ios_base local_12c0 [4744];
  size_t local_38;
  
  poVar3 = (ostream *)CONCAT44(in_register_0000003c,argc);
  if (argc < 2) {
switchD_00112932_default:
    anon_unknown.dwarf_25a9c::show_usage(poVar3);
    return 1;
  }
  switch(*argv[1]) {
  case '1':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run insertion",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    poVar3 = (ostream *)std::ostream::put('`');
    std::ostream::flush();
    if (argc < 5) goto switchD_00112932_default;
    local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (argc == 5) {
      std::__cxx11::string::string((string *)local_1540,argv[2],(allocator *)local_15e8);
      anon_unknown.dwarf_25a9c::create_dic
                ((anon_unknown_dwarf_25a9c *)local_13b8,(string *)local_1540);
      local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_13b8;
      local_13b8 = (undefined1  [8])0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
LAB_001129e4:
        operator_delete((void *)local_1540._0_8_);
      }
    }
    else {
      local_15e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_15e8._8_8_ = (pointer)0x0;
      local_15e8._16_8_ = (pointer)0x0;
      lVar4 = (ulong)(uint)argc - 5;
      ppcVar15 = argv + 5;
      do {
        if (local_15e8._8_8_ == local_15e8._16_8_) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    ((vector<char_const*,std::allocator<char_const*>> *)local_15e8,
                     (iterator)local_15e8._8_8_,ppcVar15);
        }
        else {
          *(char **)local_15e8._8_8_ = *ppcVar15;
          local_15e8._8_8_ = local_15e8._8_8_ + 8;
        }
        ppcVar15 = ppcVar15 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      std::__cxx11::string::string((string *)&local_1598,argv[2],&local_1569);
      iVar2 = std::__cxx11::string::compare((char *)&local_1598);
      if (iVar2 == 0) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x38);
        ddd::DictionaryMLT<false,_false>::DictionaryMLT
                  ((DictionaryMLT<false,_false> *)paVar11,
                   (vector<const_char_*,_std::allocator<const_char_*>_> *)local_15e8);
        local_15c0 = paVar11;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_1598);
        if (iVar2 == 0) {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x38);
          ddd::DictionaryMLT<false,_true>::DictionaryMLT
                    ((DictionaryMLT<false,_true> *)paVar11->_M_local_buf,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)local_15e8);
          local_15c0 = paVar11;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_1598);
          if (iVar2 == 0) {
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)operator_new(0x38);
            ddd::DictionaryMLT<true,_false>::DictionaryMLT
                      ((DictionaryMLT<true,_false> *)paVar11->_M_local_buf,
                       (vector<const_char_*,_std::allocator<const_char_*>_> *)local_15e8);
            local_15c0 = paVar11;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_1598);
            if (iVar2 == 0) {
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)operator_new(0x38);
              ddd::DictionaryMLT<true,_true>::DictionaryMLT
                        ((DictionaryMLT<true,_true> *)paVar11->_M_local_buf,
                         (vector<const_char_*,_std::allocator<const_char_*>_> *)local_15e8);
              local_15c0 = paVar11;
            }
            else {
              local_13b8 = (undefined1  [8])&local_13a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_13b8,local_1598._M_dataplus._M_p,
                         local_1598._M_dataplus._M_p + local_1598._M_string_length);
              anon_unknown.dwarf_25a9c::create_dic
                        ((anon_unknown_dwarf_25a9c *)&local_15c0,(string *)local_13b8);
              if (local_13b8 != (undefined1  [8])&local_13a8) {
                operator_delete((void *)local_13b8);
              }
            }
          }
        }
      }
      local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_15c0;
      local_15c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
        operator_delete(local_1598._M_dataplus._M_p);
      }
      local_1540._0_8_ = local_15e8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_15e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_001129e4;
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                 super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar16 = 1;
      anon_unknown.dwarf_25a9c::show_usage((ostream *)local_1540._0_8_);
    }
    else {
      anon_unknown.dwarf_25a9c::KeyReader::KeyReader((KeyReader *)local_13b8,argv[4]);
      if ((*(byte *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18)) & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"failed to open ",0xf);
        pcVar18 = argv[4];
        if (pcVar18 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x138240);
        }
        else {
          sVar8 = strlen(pcVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        anon_unknown.dwarf_25a9c::KeyReader::~KeyReader((KeyReader *)local_13b8);
        goto LAB_00113e64;
      }
      uVar16 = 0;
      local_1578 = argv;
      local_15a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)std::chrono::_V2::system_clock::now();
      do {
        pcVar18 = anon_unknown.dwarf_25a9c::KeyReader::next((KeyReader *)local_13b8);
        if (pcVar18 == (char *)0x0) {
          iVar2 = 6;
LAB_00113a0c:
          bVar21 = false;
        }
        else {
          iVar2 = (**(code **)(paVar11->_M_allocated_capacity + 0x20))
                            (paVar11,pcVar18,(ulong)uVar16);
          uVar16 = uVar16 + 1;
          if ((char)iVar2 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"failed to insert ",0x11);
            sVar8 = strlen(pcVar18);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,sVar8);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
            std::ostream::put('@');
            std::ostream::flush();
            iVar2 = 1;
            goto LAB_00113a0c;
          }
          iVar2 = 0;
          bVar21 = true;
        }
      } while (iVar2 == 0);
      if (iVar2 == 6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"- insertion time: ",0x12);
        ppcVar15 = local_1578;
        lVar4 = std::chrono::_V2::system_clock::now();
        poVar3 = std::ostream::_M_insert<double>
                           (((double)(lVar4 - (long)local_15a0) / 1000.0) / (double)uVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," us / key",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        anon_unknown.dwarf_25a9c::KeyReader::~KeyReader((KeyReader *)local_13b8);
        uVar14 = extraout_DL_02;
      }
      else {
        anon_unknown.dwarf_25a9c::KeyReader::~KeyReader((KeyReader *)local_13b8);
        uVar16 = 1;
        ppcVar15 = local_1578;
        uVar14 = extraout_DL_04;
        if (!bVar21) break;
      }
      anon_unknown.dwarf_25a9c::show_stat
                ((ostream *)&local_15b8,
                 (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x1,
                 (bool)uVar14);
      std::__cxx11::string::string((string *)local_15e8,ppcVar15[3],(allocator *)local_13b8);
      std::__cxx11::string::append(local_15e8);
      std::__cxx11::string::append(local_15e8);
      std::ofstream::ofstream(local_13b8,(string *)local_15e8,_S_out);
      uVar16 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
      if ((uVar16 & 5) == 0) {
        (**(code **)(paVar11->_M_allocated_capacity + 0x60))(paVar11,local_13b8);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"failed to open ",0xf);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_15e8._0_8_,local_15e8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      local_13b8 = (undefined1  [8])_VTT;
      *(undefined8 *)
       (local_13b8 +
       (long)(((DictionaryMLT<false,_false> *)((long)_VTT + -0x38))->suffix_subtries_).
             super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) = __filebuf;
      std::filebuf::~filebuf((filebuf *)&local_13b0);
      std::ios_base::~ios_base(local_12c0);
      bVar21 = (uVar16 & 5) != 0;
      if (!bVar21) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"write dic to ",0xd);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_15e8._0_8_,local_15e8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_15e8 + 0x10);
LAB_0011445a:
      uVar16 = (uint)bVar21;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar9->_M_allocated_capacity)[-2] != paVar9) {
        operator_delete((undefined1 *)(&paVar9->_M_allocated_capacity)[-2]);
      }
    }
    break;
  case '2':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run deletion",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    poVar3 = (ostream *)std::ostream::put('`');
    std::ostream::flush();
    if (argc < 5) goto switchD_00112932_default;
    std::__cxx11::string::string((string *)local_1540,argv[2],(allocator *)local_13b8);
    anon_unknown.dwarf_25a9c::read_dic((anon_unknown_dwarf_25a9c *)&local_15b8,(string *)local_1540)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
      operator_delete((void *)local_1540._0_8_);
    }
    uVar16 = 1;
    local_15a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl
                    .super__Vector_impl_data._M_start;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                 super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      anon_unknown.dwarf_25a9c::KeyReader::KeyReader((KeyReader *)local_13b8,argv[4]);
      if ((*(byte *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18)) & 5) == 0) {
        uVar20 = 0;
        local_1578 = argv;
        local_1568 = std::chrono::_V2::system_clock::now();
        do {
          pcVar18 = anon_unknown.dwarf_25a9c::KeyReader::next((KeyReader *)local_13b8);
          if (pcVar18 == (char *)0x0) {
            iVar2 = 3;
LAB_001138b2:
            bVar21 = false;
          }
          else {
            iVar2 = (**(code **)(local_15a0->_M_allocated_capacity + 0x28))(local_15a0,pcVar18);
            if (iVar2 == -1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"failed to delete ",0x11);
              sVar8 = strlen(pcVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar18,sVar8);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
              std::ostream::put('@');
              std::ostream::flush();
              iVar2 = 1;
              goto LAB_001138b2;
            }
            uVar20 = uVar20 + 1;
            iVar2 = 0;
            bVar21 = true;
          }
        } while (iVar2 == 0);
        if (iVar2 == 3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"- deletion time: ",0x11);
          ppcVar15 = local_1578;
          lVar4 = std::chrono::_V2::system_clock::now();
          poVar3 = std::ostream::_M_insert<double>
                             (((double)(lVar4 - local_1568) / 1000.0) / (double)uVar20);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," us / key",9);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          anon_unknown.dwarf_25a9c::KeyReader::~KeyReader((KeyReader *)local_13b8);
          uVar14 = extraout_DL_01;
        }
        else {
          anon_unknown.dwarf_25a9c::KeyReader::~KeyReader((KeyReader *)local_13b8);
          ppcVar15 = local_1578;
          paVar11 = local_15a0;
          uVar14 = extraout_DL_03;
          if (!bVar21) goto LAB_00114397;
        }
        anon_unknown.dwarf_25a9c::show_stat
                  ((ostream *)&local_15b8,
                   (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x1,
                   (bool)uVar14);
        std::__cxx11::string::string((string *)&local_1598,ppcVar15[3],(allocator *)local_13b8);
        std::__cxx11::string::append((char *)&local_1598);
        std::__cxx11::string::string((string *)local_15e8,ppcVar15[2],(allocator *)&local_15c0);
        std::__cxx11::string::find_last_of(local_15e8,0x12c4a9,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)local_13b8,(ulong)local_15e8);
        paVar11 = local_15a0;
        std::__cxx11::string::_M_append((char *)&local_1598,(ulong)local_13b8);
        if (local_13b8 != (undefined1  [8])&local_13a8) {
          operator_delete((void *)local_13b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_15e8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_15e8 + 0x10)) {
          operator_delete((void *)local_15e8._0_8_);
        }
        std::ofstream::ofstream(local_13b8,(string *)&local_1598,_S_out);
        uVar16 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
        if ((uVar16 & 5) == 0) {
          (**(code **)(paVar11->_M_allocated_capacity + 0x60))(paVar11,local_13b8);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"failed to open ",0xf);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_1598._M_dataplus._M_p,
                              local_1598._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        local_13b8 = (undefined1  [8])_VTT;
        *(undefined8 *)
         (local_13b8 +
         (long)(((DictionaryMLT<false,_false> *)((long)_VTT + -0x38))->suffix_subtries_).
               super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) = __filebuf;
        std::filebuf::~filebuf((filebuf *)&local_13b0);
        std::ios_base::~ios_base(local_12c0);
        bVar21 = (uVar16 & 5) != 0;
        if (!bVar21) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"write dic to ",0xd);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_1598._M_dataplus._M_p,
                              local_1598._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        uVar16 = (uint)bVar21;
        paVar11 = local_15a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
          operator_delete(local_1598._M_dataplus._M_p);
          paVar11 = local_15a0;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"failed to open ",0xf);
        pcVar18 = argv[4];
        if (pcVar18 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x138240);
        }
        else {
          sVar8 = strlen(pcVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
        anon_unknown.dwarf_25a9c::KeyReader::~KeyReader((KeyReader *)local_13b8);
        paVar11 = local_15a0;
      }
    }
    goto LAB_00114397;
  case '3':
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"run search",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    poVar3 = (ostream *)std::ostream::put('`');
    std::ostream::flush();
    if (argc < 4) goto switchD_00112932_default;
    std::__cxx11::string::string((string *)local_1540,argv[2],(allocator *)local_13b8);
    anon_unknown.dwarf_25a9c::read_dic((anon_unknown_dwarf_25a9c *)&local_15b8,(string *)local_1540)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
      operator_delete((void *)local_1540._0_8_);
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                 super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_15e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_15e8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_15e8._16_8_ = (pointer)0x0;
      std::ifstream::ifstream((istream *)local_13b8,argv[3],_S_in);
      uVar20 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
      if ((uVar20 & 5) == 0) {
        local_1598._M_string_length = 0;
        local_1598.field_2._M_local_buf[0] = '\0';
        local_1598._M_dataplus._M_p = (pointer)&local_1598.field_2;
        std::ios_base::sync_with_stdio(false);
        while( true ) {
          cVar1 = std::ios::widen((char)*(pointer *)((long)local_13b8 + -0x18) +
                                  (char)(istream *)local_13b8);
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_13b8,(string *)&local_1598,cVar1);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
          if (local_1598._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_15e8,&local_1598);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
          operator_delete(local_1598._M_dataplus._M_p);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"failed to open ",0xf);
        pcVar18 = argv[3];
        if (pcVar18 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x138240);
        }
        else {
          sVar8 = strlen(pcVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
      }
      std::ifstream::~ifstream(local_13b8);
      uVar16 = 1;
      if ((uVar20 & 5) == 0) {
        bVar21 = false;
        local_15a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)std::chrono::_V2::system_clock::now();
        uVar20 = 0;
        do {
          if (local_15e8._8_8_ != local_15e8._0_8_) {
            lVar4 = 0;
            uVar13 = 0;
            do {
              iVar2 = (**(code **)(paVar11->_M_allocated_capacity + 0x18))
                                (paVar11,*(undefined8 *)(local_15e8._0_8_ + lVar4));
              if (iVar2 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"failed to search ",0x11);
                poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,*(char **)(local_15e8._0_8_ + lVar4),
                                    *(long *)(local_15e8._0_8_ + lVar4 + 8));
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
                std::ostream::put((char)poVar3);
                std::ostream::flush();
                if (bVar21) goto LAB_00113cd9;
                goto LAB_00113db2;
              }
              uVar13 = uVar13 + 1;
              lVar4 = lVar4 + 0x20;
            } while (uVar13 < (ulong)((long)(local_15e8._8_8_ - local_15e8._0_8_) >> 5));
          }
          bVar21 = 8 < uVar20;
          uVar20 = uVar20 + 1;
        } while (uVar20 != 10);
LAB_00113cd9:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"- search time: ",0xf);
        lVar4 = std::chrono::_V2::system_clock::now();
        lVar5 = (long)(local_15e8._8_8_ - local_15e8._0_8_) >> 5;
        auVar22._8_4_ = (int)((long)(local_15e8._8_8_ - local_15e8._0_8_) >> 0x25);
        auVar22._0_8_ = lVar5;
        auVar22._12_4_ = 0x45300000;
        poVar3 = std::ostream::_M_insert<double>
                           ((((double)(lVar4 - (long)local_15a0) / 1000.0) /
                            ((auVar22._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0))) / 10.0)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," us / key (on ",0xe);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," runs)",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        uVar16 = 0;
        std::ostream::flush();
      }
LAB_00113db2:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_15e8);
      break;
    }
LAB_00113e64:
    uVar16 = 1;
    break;
  case '4':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"run rearrangement",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    poVar3 = (ostream *)std::ostream::put('`');
    std::ostream::flush();
    if (argc < 5) goto switchD_00112932_default;
    std::__cxx11::string::string((string *)local_1540,argv[3],(allocator *)local_13b8);
    anon_unknown.dwarf_25a9c::read_dic((anon_unknown_dwarf_25a9c *)&local_15b8,(string *)local_1540)
    ;
    uVar14 = extraout_DL;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
      operator_delete((void *)local_1540._0_8_);
      uVar14 = extraout_DL_00;
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                 super__Vector_impl_data._M_start;
    uVar16 = 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      poVar3 = (ostream *)&local_15b8;
      anon_unknown.dwarf_25a9c::show_stat
                (poVar3,(unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x0,
                 (bool)uVar14);
      cVar1 = *argv[2];
      if (cVar1 == '1') {
        lVar4 = 0xc;
        pcVar18 = "using pack()";
      }
      else {
        if (cVar1 != '2') {
          anon_unknown.dwarf_25a9c::show_usage(poVar3);
          break;
        }
        lVar4 = 0xf;
        pcVar18 = "using rebuild()";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar18,lVar4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
      lVar4 = std::chrono::_V2::system_clock::now();
      (**(code **)(paVar11->_M_allocated_capacity + ((ulong)(cVar1 != '1') + 7) * 8))(paVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"- rearrangement time: ",0x16);
      lVar5 = std::chrono::_V2::system_clock::now();
      poVar3 = std::ostream::_M_insert<double>((double)(lVar5 - lVar4) / 1000000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," sec",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      anon_unknown.dwarf_25a9c::show_stat
                ((ostream *)&local_15b8,
                 (unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x0,
                 need_singles);
      std::__cxx11::string::string((string *)&local_1598,argv[4],(allocator *)local_13b8);
      std::__cxx11::string::append((char *)&local_1598);
      std::__cxx11::string::string((string *)local_15e8,argv[3],(allocator *)&local_15c0);
      std::__cxx11::string::find_last_of(local_15e8,0x12c4a9,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)local_13b8,(ulong)local_15e8);
      std::__cxx11::string::_M_append((char *)&local_1598,(ulong)local_13b8);
      if (local_13b8 != (undefined1  [8])&local_13a8) {
        operator_delete((void *)local_13b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_15e8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_15e8 + 0x10)) {
        operator_delete((void *)local_15e8._0_8_);
      }
      std::ofstream::ofstream(local_13b8,(string *)&local_1598,_S_out);
      uVar16 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
      if ((uVar16 & 5) == 0) {
        (**(code **)(paVar11->_M_allocated_capacity + 0x60))(paVar11,local_13b8);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"failed to open ",0xf);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_1598._M_dataplus._M_p,
                            local_1598._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      local_13b8 = (undefined1  [8])_VTT;
      *(undefined8 *)
       (local_13b8 +
       (long)(((DictionaryMLT<false,_false> *)((long)_VTT + -0x38))->suffix_subtries_).
             super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) = __filebuf;
      std::filebuf::~filebuf((filebuf *)&local_13b0);
      std::ios_base::~ios_base(local_12c0);
      bVar21 = (uVar16 & 5) != 0;
      if (!bVar21) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"write dic to ",0xd);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_1598._M_dataplus._M_p,
                            local_1598._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      paVar9 = &local_1598.field_2;
      goto LAB_0011445a;
    }
    break;
  case '5':
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"generate random keys",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    poVar3 = (ostream *)std::ostream::put('`');
    std::ostream::flush();
    if (argc < 4) goto switchD_00112932_default;
    std::__cxx11::string::string((string *)&local_1598,argv[2],(allocator *)local_13b8);
    anon_unknown.dwarf_25a9c::read_dic((anon_unknown_dwarf_25a9c *)&local_15c0,&local_1598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
      operator_delete(local_1598._M_dataplus._M_p);
    }
    if (local_15c0 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar16 = 1;
      paVar11 = local_15c0;
      goto LAB_00114397;
    }
    local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_start = (KvPair *)0x0;
    local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (KvPair *)0x0;
    local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(local_15c0->_M_allocated_capacity + 0x30))();
    local_13b8 = (undefined1  [8])0x1571;
    lVar4 = 1;
    uVar13 = 0x1571;
    do {
      uVar13 = (ulong)(((uint)(uVar13 >> 0x1e) ^ (uint)uVar13) * 0x6c078965 + (int)lVar4);
      *(ulong *)(local_13b8 + lVar4 * 8) = uVar13;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    local_38 = 0x270;
    std::
    shuffle<__gnu_cxx::__normal_iterator<ddd::KvPair*,std::vector<ddd::KvPair,std::allocator<ddd::KvPair>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ((__normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                )local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<ddd::KvPair_*,_std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>_>
                )local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
                 super__Vector_impl_data._M_finish,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_13b8);
    if (argc == 4) {
      std::__cxx11::string::string((string *)local_1540,argv[3],(allocator *)local_13b8);
      std::__cxx11::string::append((char *)local_1540);
      std::ofstream::ofstream((ostream *)local_13b8,(string *)local_1540,_S_out);
      uVar20 = *(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18));
      if ((uVar20 & 5) == 0) {
        if (local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar4 = 0;
          uVar13 = 0;
          do {
            pcVar18 = *(char **)((long)local_15b8.
                                       super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar4);
            if (pcVar18 == (char *)0x0) {
              std::ios::clear((int)local_15e8 + (int)*(pointer *)((long)local_13b8 + -0x18) + 0x230)
              ;
            }
            else {
              sVar8 = strlen(pcVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_13b8,pcVar18,sVar8);
            }
            cVar1 = (char)(ostream *)local_13b8;
            std::ios::widen((char)*(pointer *)((long)local_13b8 + -0x18) + cVar1);
            std::ostream::put(cVar1);
            std::ostream::flush();
            uVar13 = uVar13 + 1;
            lVar4 = lVar4 + 0x28;
          } while (uVar13 < (ulong)(((long)local_15b8.
                                           super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_15b8.
                                           super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"write ",6);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," keys to ",9);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)local_1540._0_8_,local_1540._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"failed to open ",0xf);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_1540._0_8_,local_1540._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      }
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_13b8 = (undefined1  [8])_VTT;
      *(undefined8 *)
       (local_13b8 +
       (long)(((DictionaryMLT<false,_false> *)((long)_VTT + -0x38))->suffix_subtries_).
             super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) = __filebuf;
      std::filebuf::~filebuf((filebuf *)&local_13b0);
      std::ios_base::~ios_base(local_12c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1540._0_8_ != &((string *)local_1540)->field_2) {
        operator_delete((void *)local_1540._0_8_);
      }
      uVar16 = 1;
      if ((uVar20 & 5) == 0) goto LAB_00114017;
    }
    else {
      local_1578 = argv;
      std::__cxx11::string::string((string *)local_13b8,argv[4],(allocator *)local_15e8);
      __nptr = local_13b8;
      piVar6 = __errno_location();
      iVar2 = *piVar6;
      *piVar6 = 0;
      uVar13 = strtol((char *)__nptr,(char **)local_1540,10);
      ppcVar15 = local_1578;
      if ((undefined1  [8])local_1540._0_8_ == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_001144e0:
        uVar12 = std::__throw_out_of_range("stoi");
        operator_delete((string *)local_13b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1598._M_dataplus._M_p != &local_1598.field_2) {
          operator_delete(local_1598._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_15e8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete((void *)local_15e8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)
                        local_15b8.super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>.
                        _M_impl.super__Vector_impl_data._M_start + 8))();
        }
        _Unwind_Resume(uVar12);
      }
      uVar16 = (uint)uVar13;
      if (((long)(int)uVar16 != uVar13) || (*piVar6 == 0x22)) goto LAB_001144e0;
      if (*piVar6 == 0) {
        *piVar6 = iVar2;
      }
      if (local_13b8 != (undefined1  [8])&local_13a8) {
        operator_delete((void *)local_13b8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- ",2);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," patterns",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (0 < (int)uVar16) {
        local_1568 = CONCAT44(local_1568._4_4_,(int)(100 / (uVar13 & 0xffffffff)));
        local_1560 = (ulong)(uVar16 & 0x7fffffff);
        local_1548 = _VTT;
        local_1550 = __filebuf;
        local_1558 = (ulong)(uVar16 + 1);
        uVar13 = 1;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1540);
          pcVar18 = ppcVar15[3];
          if (pcVar18 == (char *)0x0) {
            std::ios::clear((int)(string *)local_1540 + 0x10 +
                            (int)*(undefined8 *)(local_1530._M_allocated_capacity - 0x18));
          }
          else {
            sVar8 = strlen(pcVar18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&((string *)local_1540)->field_2,pcVar18,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((string *)local_1540)->field_2,".",1);
          *(undefined8 *)((long)auStack_1520 + *(long *)(local_1530._M_allocated_capacity - 0x18)) =
               3;
          lVar4 = *(long *)(local_1530._M_allocated_capacity - 0x18);
          if (acStack_1450[lVar4 + 1] == '\0') {
            cVar1 = std::ios::widen((char)(string *)local_1540 + '\x10' + (char)lVar4);
            acStack_1450[lVar4] = cVar1;
            acStack_1450[lVar4 + 1] = '\x01';
          }
          acStack_1450[lVar4] = '0';
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&((string *)local_1540)->field_2,
                              (int)local_1568 * (int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,".keys",5);
          std::__cxx11::stringbuf::str();
          std::ofstream::ofstream((string *)local_13b8,(string *)local_15e8,_S_out);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_15e8 + 0x10)) {
            operator_delete((void *)local_15e8._0_8_);
          }
          local_15a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT44(local_15a0._4_4_,
                                   *(uint *)((long)auStack_1398 +
                                            (long)*(pointer *)((long)local_13b8 + -0x18)));
          if ((*(uint *)((long)auStack_1398 + (long)*(pointer *)((long)local_13b8 + -0x18)) & 5) ==
              0) {
            uVar17 = ((ulong)(((long)local_15b8.
                                     super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_15b8.
                                     super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333) / local_1560) * uVar13;
            if (uVar17 != 0) {
              lVar4 = 0;
              uVar19 = 0;
              do {
                pcVar18 = *(char **)((long)local_15b8.
                                           super__Vector_base<ddd::KvPair,_std::allocator<ddd::KvPair>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar4);
                if (pcVar18 == (char *)0x0) {
                  std::ios::clear((int)local_15e8 + (int)*(pointer *)((long)local_13b8 + -0x18) +
                                  0x230);
                }
                else {
                  sVar8 = strlen(pcVar18);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_13b8,pcVar18,sVar8);
                }
                cVar1 = (char)(string *)local_13b8;
                std::ios::widen((char)*(pointer *)((long)local_13b8 + -0x18) + cVar1);
                std::ostream::put(cVar1);
                std::ostream::flush();
                uVar19 = uVar19 + 1;
                lVar4 = lVar4 + 0x28;
              } while (uVar19 < uVar17);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"write ",6);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," keys to ",9);
            std::__cxx11::stringbuf::str();
            ppcVar15 = local_1578;
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,(char *)local_15e8._0_8_,local_15e8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"failed to open ",0xf);
            std::__cxx11::stringbuf::str();
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_15e8._0_8_,local_15e8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_15e8 + 0x10)) {
            operator_delete((void *)local_15e8._0_8_);
          }
          local_13b8 = (undefined1  [8])local_1548;
          *(undefined8 *)
           (local_13b8 +
           (long)(((DictionaryMLT<false,_false> *)((long)local_1548 + -0x38))->suffix_subtries_).
                 super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) = local_1550;
          std::filebuf::~filebuf((filebuf *)&local_13b0);
          std::ios_base::~ios_base(local_12c0);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1540);
          std::ios_base::~ios_base(local_14c0);
          if (((ulong)local_15a0 & 5) != 0) {
            uVar16 = 1;
            goto LAB_001142a0;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_1558);
      }
LAB_00114017:
      uVar16 = 0;
    }
LAB_001142a0:
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::~vector(&local_15b8);
    paVar11 = local_15c0;
LAB_00114397:
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return uVar16;
    }
    sVar10 = paVar11->_M_allocated_capacity;
    goto LAB_00114477;
  default:
    goto switchD_00112932_default;
  }
  if (paVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return uVar16;
  }
  sVar10 = paVar11->_M_allocated_capacity;
LAB_00114477:
  (**(code **)(sVar10 + 8))(paVar11);
  return uVar16;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc < 2) {
    show_usage(std::cerr);
    return 1;
  }

  switch (*argv[1]) {
    case '1':
      return run_insertion(argc, argv);
    case '2':
      return run_deletion(argc, argv);
    case '3':
      return run_search(argc, argv);
    case '4':
      return run_rearrangement(argc, argv);
    case '5':
      return generate_keys(argc, argv);
    default:
      show_usage(std::cerr);
      break;
  }

  return 1;
}